

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-maxpooling2d.h
# Opt level: O3

void __thiscall
dynet::MaxPooling2D::MaxPooling2D
          (MaxPooling2D *this,initializer_list<unsigned_int> *a,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *k,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *s,bool padding_type)

{
  allocator_type local_29;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Node_005b4008;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&(this->super_Node).args,*a,&local_29);
  (this->super_Node).dim.nd = 0;
  (this->super_Node).dim.bd = 1;
  (this->super_Node).device = (Device *)0x0;
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__MaxPooling2D_005b7170;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->ksize,k);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->stride,s);
  this->is_valid = padding_type;
  return;
}

Assistant:

explicit MaxPooling2D(const std::initializer_list<VariableIndex>& a, const std::vector<unsigned>& k, const std::vector<unsigned>& s,
    const bool padding_type = true)
      : Node(a), ksize(k), stride(s), is_valid(padding_type) {}